

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteGenericLoop<duckdb::interval_t,duckdb::interval_t,bool,duckdb::BinarySingleArgumentOperatorWrapper,duckdb::NotEquals,bool>
               (interval_t *ldata,interval_t *rdata,bool *result_data,SelectionVector *lsel,
               SelectionVector *rsel,idx_t count,ValidityMask *lvalidity,ValidityMask *rvalidity,
               ValidityMask *result_validity,bool fun)

{
  undefined4 uVar1;
  undefined4 uVar2;
  sel_t *psVar3;
  sel_t *psVar4;
  long lVar5;
  int iVar9;
  long lVar6;
  unsigned_long *puVar7;
  long lVar8;
  int iVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar11;
  element_type *peVar12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var13;
  ulong uVar14;
  TemplatedValidityData<unsigned_long> *pTVar15;
  _Head_base<0UL,_unsigned_long_*,_false> _Var16;
  ulong uVar17;
  idx_t idx_in_entry;
  long lVar18;
  long lVar19;
  ulong uVar20;
  bool bVar21;
  element_type *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  buffer_ptr<ValidityBuffer> *local_40;
  idx_t local_38;
  
  if ((rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0
      && (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
         (unsigned_long *)0x0) {
    if (count != 0) {
      psVar3 = lsel->sel_vector;
      psVar4 = rsel->sel_vector;
      uVar20 = 0;
      do {
        uVar14 = uVar20;
        if (psVar3 != (sel_t *)0x0) {
          uVar14 = (ulong)psVar3[uVar20];
        }
        uVar17 = uVar20;
        if (psVar4 != (sel_t *)0x0) {
          uVar17 = (ulong)psVar4[uVar20];
        }
        lVar8._0_4_ = ldata[uVar14].months;
        lVar8._4_4_ = ldata[uVar14].days;
        lVar5 = ldata[uVar14].micros;
        uVar1 = rdata[uVar17].months;
        iVar9 = rdata[uVar17].days;
        lVar6 = rdata[uVar17].micros;
        if ((((undefined4)lVar8 == uVar1) && (lVar8._4_4_ == iVar9)) &&
           (iVar9 = lVar8._4_4_, lVar5 == lVar6)) {
          bVar21 = false;
        }
        else {
          lVar18 = (lVar8 >> 0x20) + lVar5 / 86400000000;
          lVar19 = (long)iVar9 + lVar6 / 86400000000;
          bVar21 = true;
          if (((long)(int)(undefined4)lVar8 + lVar18 / 0x1e == (long)(int)uVar1 + lVar19 / 0x1e) &&
             (lVar18 % 0x1e == lVar19 % 0x1e)) {
            bVar21 = lVar5 % 86400000000 != lVar6 % 86400000000;
          }
        }
        result_data[uVar20] = bVar21;
        uVar20 = uVar20 + 1;
      } while (count != uVar20);
    }
  }
  else if (count != 0) {
    psVar3 = lsel->sel_vector;
    psVar4 = rsel->sel_vector;
    local_40 = &(result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data;
    uVar20 = 0;
    do {
      uVar14 = uVar20;
      if (psVar3 != (sel_t *)0x0) {
        uVar14 = (ulong)psVar3[uVar20];
      }
      uVar17 = uVar20;
      if (psVar4 != (sel_t *)0x0) {
        uVar17 = (ulong)psVar4[uVar20];
      }
      puVar7 = (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (((puVar7 == (unsigned_long *)0x0) || ((puVar7[uVar14 >> 6] >> (uVar14 & 0x3f) & 1) != 0))
         && ((puVar7 = (rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask,
             puVar7 == (unsigned_long *)0x0 || ((puVar7[uVar17 >> 6] >> (uVar17 & 0x3f) & 1) != 0)))
         ) {
        lVar5._0_4_ = ldata[uVar14].months;
        lVar5._4_4_ = ldata[uVar14].days;
        lVar8 = ldata[uVar14].micros;
        uVar2 = rdata[uVar17].months;
        iVar10 = rdata[uVar17].days;
        lVar6 = rdata[uVar17].micros;
        if ((((undefined4)lVar5 == uVar2) && (lVar5._4_4_ == iVar10)) &&
           (iVar10 = lVar5._4_4_, lVar8 == lVar6)) {
          bVar21 = false;
        }
        else {
          lVar18 = (lVar5 >> 0x20) + lVar8 / 86400000000;
          lVar19 = (long)iVar10 + lVar6 / 86400000000;
          bVar21 = true;
          if (((long)(int)(undefined4)lVar5 + lVar18 / 0x1e == (long)(int)uVar2 + lVar19 / 0x1e) &&
             (lVar18 % 0x1e == lVar19 % 0x1e)) {
            bVar21 = lVar8 % 86400000000 != lVar6 % 86400000000;
          }
        }
        result_data[uVar20] = bVar21;
      }
      else {
        _Var16._M_head_impl =
             (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (_Var16._M_head_impl == (unsigned_long *)0x0) {
          local_38 = (result_validity->super_TemplatedValidityMask<unsigned_long>).capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_58,&local_38);
          p_Var13 = p_Stack_50;
          peVar12 = local_58;
          local_58 = (element_type *)0x0;
          p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this = (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = peVar12;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var13;
          if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
             p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
          }
          pTVar15 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (local_40);
          _Var16._M_head_impl =
               (pTVar15->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask =
               _Var16._M_head_impl;
        }
        bVar11 = (byte)uVar20 & 0x3f;
        _Var16._M_head_impl[uVar20 >> 6] =
             _Var16._M_head_impl[uVar20 >> 6] &
             (-2L << bVar11 | 0xfffffffffffffffeU >> 0x40 - bVar11);
      }
      uVar20 = uVar20 + 1;
    } while (count != uVar20);
  }
  return;
}

Assistant:

static void ExecuteGenericLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                               RESULT_TYPE *__restrict result_data, const SelectionVector *__restrict lsel,
	                               const SelectionVector *__restrict rsel, idx_t count, ValidityMask &lvalidity,
	                               ValidityMask &rvalidity, ValidityMask &result_validity, FUNC fun) {
		if (!lvalidity.AllValid() || !rvalidity.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto lindex = lsel->get_index(i);
				auto rindex = rsel->get_index(i);
				if (lvalidity.RowIsValid(lindex) && rvalidity.RowIsValid(rindex)) {
					auto lentry = ldata[lindex];
					auto rentry = rdata[rindex];
					result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
					    fun, lentry, rentry, result_validity, i);
				} else {
					result_validity.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[lsel->get_index(i)];
				auto rentry = rdata[rsel->get_index(i)];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, result_validity, i);
			}
		}
	}